

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_sse2.c
# Opt level: O0

void aom_quantize_b_32x32_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  __m128i round_00;
  __m128i zero_00;
  __m128i zero_01;
  __m128i zero_02;
  __m128i zero_03;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i dequant_02;
  __m128i dequant_03;
  __m128i qcoeff_00;
  __m128i qcoeff_01;
  __m128i qcoeff_02;
  __m128i qcoeff_03;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  longlong lVar23;
  longlong lVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  undefined8 *in_RCX;
  int *piVar31;
  long lVar32;
  short *in_RDX;
  longlong extraout_RDX;
  tran_low_t *coeff_ptr_00;
  longlong extraout_RDX_00;
  tran_low_t *coeff_ptr_01;
  longlong in_RSI;
  __m128i *cmp_mask1_00;
  int *log_scale_00;
  tran_low_t *in_RDI;
  tran_low_t *ptVar33;
  __m128i *palVar34;
  undefined8 *in_R8;
  __m128i *palVar35;
  undefined8 *in_R9;
  __m128i *palVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  ulong extraout_XMM0_Qa_09;
  ulong extraout_XMM0_Qa_10;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  ulong extraout_XMM0_Qb_09;
  ulong extraout_XMM0_Qb_10;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar60;
  short sVar61;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  __m128i alVar62;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i coeff_vals;
  __m128i coeff_vals_00;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i coeff_vals_01;
  __m128i coeff_vals_02;
  __m128i mask;
  __m128i mask_00;
  __m128i sign;
  __m128i sign_00;
  __m128i sign_01;
  __m128i sign_02;
  __m128i sign_03;
  __m128i sign_04;
  __m128i sign_05;
  __m128i sign_06;
  __m128i quant_00;
  __m128i quant_01;
  __m128i quant_02;
  __m128i quant_03;
  __m128i round_01;
  __m128i round_02;
  __m128i round_03;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  int prescan_add_val;
  int factor;
  int abs_coeff;
  int coeff_sign;
  int coeff;
  int rc_3;
  int qcoeff;
  int rc_2;
  int i_3;
  int rc_1;
  int i_2;
  int rc;
  int i_1;
  int first;
  __m128i threshold [2];
  int i;
  qm_val_t wt;
  int thresh [4];
  int prescan_add [2];
  int zbins [2];
  __m128i mask1;
  __m128i mask0;
  __m128i all_zero;
  __m128i cmp_mask1;
  __m128i cmp_mask0;
  __m128i qcoeff1;
  __m128i qcoeff0;
  __m128i coeff1_sign;
  __m128i coeff0_sign;
  __m128i coeff1;
  __m128i coeff0;
  __m128i shift;
  __m128i dequant;
  __m128i quant;
  __m128i round;
  __m128i zbin;
  __m128i log_scale_vec;
  __m128i one;
  __m128i zero;
  int eob;
  int is_found1;
  int is_found0;
  int non_zero_count_prescan_add_zero;
  int non_zero_count;
  int log_scale;
  int index;
  int *in_stack_fffffffffffff788;
  int local_840;
  int local_838;
  int local_830;
  int local_82c;
  int iVar63;
  undefined3 in_stack_fffffffffffff804;
  undefined4 uVar64;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  undefined4 uVar65;
  undefined4 uVar66;
  int *in_stack_fffffffffffff818;
  __m128i *threshold_00;
  __m128i *qcoeff1_00;
  __m128i *qcoeff0_00;
  short local_7a8;
  short sStack_7a6;
  short sStack_7a4;
  short sStack_7a2;
  short sStack_7a0;
  short sStack_79e;
  short sStack_79c;
  short sStack_79a;
  short local_798;
  short sStack_796;
  short sStack_794;
  short sStack_792;
  short sStack_790;
  short sStack_78e;
  short sStack_78c;
  short sStack_78a;
  __m128i local_788;
  ulong local_778;
  ulong uStack_770;
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined4 local_6a4;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  undefined8 local_690;
  longlong local_668;
  tran_low_t *local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined1 *local_640;
  undefined8 local_638;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  undefined4 local_628;
  undefined4 uStack_624;
  undefined4 uStack_61c;
  undefined8 local_618;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 local_608;
  undefined4 uStack_604;
  undefined4 uStack_5fc;
  undefined4 local_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined4 uStack_5dc;
  undefined8 local_5d8;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 local_5c8;
  undefined4 uStack_5c4;
  undefined4 uStack_5bc;
  undefined8 local_5b8;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 local_5a8;
  undefined4 uStack_5a4;
  undefined4 uStack_59c;
  undefined4 local_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 local_588;
  undefined4 uStack_584;
  undefined4 uStack_57c;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 local_568;
  undefined4 uStack_564;
  undefined4 uStack_55c;
  undefined8 local_558;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 local_548;
  undefined4 uStack_544;
  undefined4 uStack_53c;
  undefined8 local_538;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 local_528;
  undefined4 uStack_524;
  undefined4 uStack_51c;
  undefined4 local_518;
  undefined4 uStack_514;
  undefined4 local_4ec;
  undefined4 local_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined4 local_4ac;
  undefined4 local_48c;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ulong local_3f8;
  ulong uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  ulong local_3d8;
  ulong uStack_3d0;
  ulong local_3c8;
  ulong uStack_3c0;
  ulong local_3b8;
  ulong uStack_3b0;
  ulong local_3a8;
  ulong uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ulong local_198;
  ulong uStack_190;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  undefined2 local_114;
  undefined2 local_112;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  undefined8 *puVar30;
  undefined8 uVar59;
  
  local_690._4_4_ = 0x10;
  local_690._0_4_ = 1;
  local_694 = 0;
  local_698 = 0;
  local_69c = 0;
  local_6a0 = 0;
  local_6a4 = 0xffffffff;
  local_658 = 0;
  uStack_650 = 0;
  local_6b8 = 0;
  uStack_6b0 = 0;
  local_112 = 1;
  local_2a = 1;
  local_2c = 1;
  local_2e = 1;
  local_30 = 1;
  local_32 = 1;
  local_34 = 1;
  local_36 = 1;
  local_38 = 1;
  local_6c8 = 0x1000100010001;
  uStack_6c0 = 0x1000100010001;
  local_114 = 1;
  local_2 = 1;
  local_4 = 1;
  local_6 = 1;
  local_8 = 1;
  local_a = 1;
  local_c = 1;
  local_e = 1;
  local_10 = 1;
  local_6d8 = 0x1000100010001;
  uStack_6d0 = 0x1000100010001;
  qcoeff0_00 = (__m128i *)0x0;
  threshold_00 = (__m128i *)0x0;
  qcoeff1_00 = (__m128i *)0x0;
  iVar27 = *in_RDX + 1 >> 1;
  iVar28 = in_RDX[1] + 1 >> 1;
  uVar64 = CONCAT13(0x20,in_stack_fffffffffffff804);
  puVar30 = in_RCX;
  for (iVar63 = 0; iVar63 < 2; iVar63 = iVar63 + 1) {
    *(int *)(&stack0xfffffffffffff818 + (long)iVar63 * 4) =
         *(short *)((long)_prescan_add_val + (long)iVar63 * 2) * 0x145 + 0x40 >> 7;
    uVar29 = (*(int *)(&stack0xfffffffffffff820 + (long)iVar63 * 4) * 0x20 +
             *(int *)(&stack0xfffffffffffff818 + (long)iVar63 * 4)) - 1;
    puVar30 = (undefined8 *)(ulong)uVar29;
    *(uint *)(&stack0xfffffffffffff808 + (long)iVar63 * 4) = uVar29;
  }
  local_640 = &stack0xfffffffffffff808;
  local_82c = -1;
  uVar59 = *(undefined8 *)in_RDX;
  uVar12 = *(undefined8 *)(in_RDX + 4);
  uVar13 = *in_RCX;
  uVar14 = in_RCX[1];
  local_708 = *in_R8;
  uStack_700 = in_R8[1];
  local_718 = *_prescan_add_val;
  uStack_710 = _prescan_add_val[1];
  local_728 = *in_R9;
  uStack_720 = in_R9[1];
  local_b8._0_2_ = (short)uVar59;
  local_b8._2_2_ = (short)((ulong)uVar59 >> 0x10);
  local_b8._4_2_ = (short)((ulong)uVar59 >> 0x20);
  local_b8._6_2_ = (short)((ulong)uVar59 >> 0x30);
  uStack_b0._0_2_ = (short)uVar12;
  uStack_b0._2_2_ = (short)((ulong)uVar12 >> 0x10);
  uStack_b0._4_2_ = (short)((ulong)uVar12 >> 0x20);
  uStack_b0._6_2_ = (short)((ulong)uVar12 >> 0x30);
  local_6e8._0_4_ = CONCAT22(local_b8._2_2_ + 1U,(short)local_b8 + 1U);
  local_6e8._0_6_ = CONCAT24(local_b8._4_2_ + 1U,(undefined4)local_6e8);
  local_6e8 = CONCAT26(local_b8._6_2_ + 1U,(undefined6)local_6e8);
  uStack_6e0._0_4_ = CONCAT22(uStack_b0._2_2_ + 1U,(short)uStack_b0 + 1U);
  uStack_6e0._0_6_ = CONCAT24(uStack_b0._4_2_ + 1U,(undefined4)uStack_6e0);
  uStack_6e0 = CONCAT26(uStack_b0._6_2_ + 1U,(undefined6)uStack_6e0);
  local_d8._0_2_ = (short)uVar13;
  local_d8._2_2_ = (short)((ulong)uVar13 >> 0x10);
  local_d8._4_2_ = (short)((ulong)uVar13 >> 0x20);
  local_d8._6_2_ = (short)((ulong)uVar13 >> 0x30);
  uStack_d0._0_2_ = (short)uVar14;
  uStack_d0._2_2_ = (short)((ulong)uVar14 >> 0x10);
  uStack_d0._4_2_ = (short)((ulong)uVar14 >> 0x20);
  uStack_d0._6_2_ = (short)((ulong)uVar14 >> 0x30);
  local_6f8._0_4_ = CONCAT22(local_d8._2_2_ + 1U,(short)local_d8 + 1U);
  local_6f8._0_6_ = CONCAT24(local_d8._4_2_ + 1U,(undefined4)local_6f8);
  local_6f8 = CONCAT26(local_d8._6_2_ + 1U,(undefined6)local_6f8);
  uStack_6f0._0_4_ = CONCAT22(uStack_d0._2_2_ + 1U,(short)uStack_d0 + 1U);
  uStack_6f0._0_6_ = CONCAT24(uStack_d0._4_2_ + 1U,(undefined4)uStack_6f0);
  uStack_6f0 = CONCAT26(uStack_d0._6_2_ + 1U,(undefined6)uStack_6f0);
  local_78 = local_6e8;
  uStack_70 = uStack_6e0;
  local_7c = 1;
  uVar37 = (ushort)((short)local_b8 + 1U) >> 1;
  uVar38 = (ushort)(local_b8._2_2_ + 1U) >> 1;
  uVar39 = (ushort)(local_b8._4_2_ + 1U) >> 1;
  uVar40 = (ushort)(local_b8._6_2_ + 1U) >> 1;
  uVar41 = (ushort)((short)uStack_b0 + 1U) >> 1;
  uVar42 = (ushort)(uStack_b0._2_2_ + 1U) >> 1;
  uVar43 = (ushort)(uStack_b0._4_2_ + 1U) >> 1;
  uVar44 = (ushort)(uStack_b0._6_2_ + 1U) >> 1;
  local_6e8._0_4_ = CONCAT22(uVar38,uVar37);
  local_6e8._0_6_ = CONCAT24(uVar39,(undefined4)local_6e8);
  local_6e8 = CONCAT26(uVar40,(undefined6)local_6e8);
  uStack_6e0._0_4_ = CONCAT22(uVar42,uVar41);
  uStack_6e0._0_6_ = CONCAT24(uVar43,(undefined4)uStack_6e0);
  uStack_6e0 = CONCAT26(uVar44,(undefined6)uStack_6e0);
  local_98 = local_6f8;
  uStack_90 = uStack_6f0;
  local_9c = 1;
  local_6f8._0_4_ = CONCAT22((ushort)(local_d8._2_2_ + 1U) >> 1,(ushort)((short)local_d8 + 1U) >> 1)
  ;
  local_6f8._0_6_ = CONCAT24((ushort)(local_d8._4_2_ + 1U) >> 1,(undefined4)local_6f8);
  local_6f8 = CONCAT26((ushort)(local_d8._6_2_ + 1U) >> 1,(undefined6)local_6f8);
  uStack_6f0._0_4_ =
       CONCAT22((ushort)(uStack_d0._2_2_ + 1U) >> 1,(ushort)((short)uStack_d0 + 1U) >> 1);
  uStack_6f0._0_6_ = CONCAT24((ushort)(uStack_d0._4_2_ + 1U) >> 1,(undefined4)uStack_6f0);
  uStack_6f0 = CONCAT26((ushort)(uStack_d0._6_2_ + 1U) >> 1,(undefined6)uStack_6f0);
  local_58 = local_6e8;
  uStack_50 = uStack_6e0;
  local_6e8._0_4_ = CONCAT22(uVar38 - 1,uVar37 - 1);
  local_6e8._0_6_ = CONCAT24(uVar39 - 1,(undefined4)local_6e8);
  local_6e8 = CONCAT26(uVar40 - 1,(undefined6)local_6e8);
  uStack_6e0._0_4_ = CONCAT22(uVar42 - 1,uVar41 - 1);
  uStack_6e0._0_6_ = CONCAT24(uVar43 - 1,(undefined4)uStack_6e0);
  uStack_6e0 = CONCAT26(uVar44 - 1,(undefined6)uStack_6e0);
  uVar65 = in_stack_fffffffffffff80c;
  uVar66 = in_stack_fffffffffffff80c;
  local_668 = in_RSI;
  local_660 = in_RDI;
  local_e8 = local_6d8;
  uStack_e0 = uStack_6d0;
  local_d8 = uVar13;
  uStack_d0 = uVar14;
  local_c8 = local_6d8;
  uStack_c0 = uStack_6d0;
  local_b8 = uVar59;
  uStack_b0 = uVar12;
  local_68 = local_6c8;
  uStack_60 = uStack_6c0;
  local_48 = local_6c8;
  uStack_40 = uStack_6c0;
  local_28 = local_6d8;
  uStack_20 = uStack_6d0;
  uStack_514 = in_stack_fffffffffffff80c;
  load_coefficients(in_RDI);
  ptVar33 = local_660 + 8;
  local_738 = extraout_XMM0_Qa;
  uStack_730 = extraout_XMM0_Qb;
  alVar62 = load_coefficients(ptVar33);
  sign[0] = alVar62[1];
  local_488 = local_738;
  uStack_480 = uStack_730;
  local_48c = 0xf;
  auVar18._8_8_ = uStack_730;
  auVar18._0_8_ = local_738;
  local_758 = psraw(auVar18,ZEXT416(0xf));
  local_4ac = 0xf;
  auVar17._8_8_ = extraout_XMM0_Qb_00;
  auVar17._0_8_ = extraout_XMM0_Qa_00;
  local_768 = psraw(auVar17,ZEXT416(0xf));
  alVar62[1] = in_RSI;
  alVar62[0] = (longlong)ptVar33;
  sign[1] = (longlong)puVar30;
  alVar62 = invert_sign_sse2(alVar62,sign);
  sign_00[0] = alVar62[1];
  a[1] = in_RSI;
  a[0] = (longlong)ptVar33;
  sign_00[1] = (longlong)puVar30;
  local_778 = extraout_XMM0_Qa_01;
  uStack_770 = extraout_XMM0_Qb_01;
  invert_sign_sse2(a,sign_00);
  local_788[1] = extraout_XMM0_Qb_02;
  local_788[0] = extraout_XMM0_Qa_02;
  palVar36 = (__m128i *)&stack0xfffffffffffff838;
  update_mask0(qcoeff0_00,qcoeff1_00,threshold_00,(int16_t *)CONCAT44(iVar28,iVar27),
               in_stack_fffffffffffff818,(__m128i *)CONCAT44(uVar66,uVar65));
  local_408 = local_778;
  uVar25 = local_408;
  uStack_400 = uStack_770;
  uVar26 = uStack_400;
  local_418 = local_6e8;
  uStack_410 = uStack_6e0;
  local_408._0_2_ = (short)local_778;
  local_408._2_2_ = (short)(local_778 >> 0x10);
  local_408._4_2_ = (short)(local_778 >> 0x20);
  local_408._6_2_ = (short)(local_778 >> 0x30);
  uStack_400._0_2_ = (short)uStack_770;
  uStack_400._2_2_ = (short)(uStack_770 >> 0x10);
  uStack_400._4_2_ = (short)(uStack_770 >> 0x20);
  uStack_400._6_2_ = (short)(uStack_770 >> 0x30);
  local_798 = -(ushort)((short)local_6e8 < (short)local_408);
  sVar56 = (short)((ulong)local_6e8 >> 0x10);
  sStack_796 = -(ushort)(sVar56 < local_408._2_2_);
  sVar57 = (short)((ulong)local_6e8 >> 0x20);
  sStack_794 = -(ushort)(sVar57 < local_408._4_2_);
  sVar58 = (short)((ulong)local_6e8 >> 0x30);
  sStack_792 = -(ushort)(sVar58 < local_408._6_2_);
  sStack_790 = -(ushort)((short)uStack_6e0 < (short)uStack_400);
  sStack_78e = -(ushort)((short)((ulong)uStack_6e0 >> 0x10) < uStack_400._2_2_);
  sVar60 = (short)((ulong)uStack_6e0 >> 0x20);
  sStack_78c = -(ushort)(sVar60 < uStack_400._4_2_);
  sVar61 = (short)((ulong)uStack_6e0 >> 0x30);
  sStack_78a = -(ushort)(sVar61 < uStack_400._6_2_);
  uStack_51c = uStack_6e0._4_4_;
  _local_518 = CONCAT44(uStack_514,(undefined4)local_6d8);
  local_538 = local_6e8;
  uStack_52c = uStack_6e0._4_4_;
  uStack_524 = (undefined4)((ulong)local_6e8 >> 0x20);
  _local_528 = CONCAT44(uStack_524,(undefined4)local_6d8);
  auVar1._4_8_ = uStack_6e0;
  auVar1._0_4_ = uStack_524;
  auVar45._0_8_ = auVar1._0_8_ << 0x20;
  auVar45._8_4_ = uStack_530;
  auVar45._12_4_ = uStack_6e0._4_4_;
  uStack_6e0 = auVar45._8_8_;
  local_428 = local_788[0];
  lVar23 = local_428;
  uStack_420 = local_788[1];
  lVar24 = uStack_420;
  local_438 = local_6e8;
  local_428._0_2_ = (short)local_788[0];
  local_428._2_2_ = local_788[0]._2_2_;
  local_428._4_2_ = local_788[0]._4_2_;
  local_428._6_2_ = local_788[0]._6_2_;
  uStack_420._0_2_ = (short)local_788[1];
  uStack_420._2_2_ = local_788[1]._2_2_;
  uStack_420._4_2_ = local_788[1]._4_2_;
  uStack_420._6_2_ = local_788[1]._6_2_;
  uStack_430._0_2_ = (short)uStack_530;
  uStack_430._2_2_ = (short)((uint)uStack_530 >> 0x10);
  local_7a8 = -(ushort)((short)local_6e8 < (short)local_428);
  sStack_7a6 = -(ushort)(sVar56 < local_428._2_2_);
  sStack_7a4 = -(ushort)(sVar57 < local_428._4_2_);
  sStack_7a2 = -(ushort)(sVar58 < local_428._6_2_);
  sStack_7a0 = -(ushort)((short)uStack_430 < (short)uStack_420);
  sStack_79e = -(ushort)(uStack_430._2_2_ < uStack_420._2_2_);
  sStack_79c = -(ushort)(sVar60 < uStack_420._4_2_);
  sStack_79a = -(ushort)(sVar61 < uStack_420._6_2_);
  palVar34 = (__m128i *)&local_798;
  cmp_mask1_00 = (__m128i *)&local_7a8;
  piVar31 = &local_6a0;
  palVar35 = (__m128i *)&stack0xfffffffffffff828;
  uStack_430 = uStack_6e0;
  local_428 = lVar23;
  uStack_420 = lVar24;
  local_408 = uVar25;
  uStack_400 = uVar26;
  update_mask1(palVar34,cmp_mask1_00,_qcoeff,piVar31,palVar35);
  local_3c8 = CONCAT26(sStack_792,CONCAT24(sStack_794,CONCAT22(sStack_796,local_798)));
  uStack_3c0 = CONCAT26(sStack_78a,CONCAT24(sStack_78c,CONCAT22(sStack_78e,sStack_790)));
  local_3d8 = CONCAT26(sStack_7a2,CONCAT24(sStack_7a4,CONCAT22(sStack_7a6,local_7a8)));
  uStack_3d0 = CONCAT26(sStack_79a,CONCAT24(sStack_79c,CONCAT22(sStack_79e,sStack_7a0)));
  local_3a8 = local_3c8 | local_3d8;
  uStack_3a0 = uStack_3c0 | uStack_3d0;
  auVar20._8_8_ = uStack_3a0;
  auVar20._0_8_ = local_3a8;
  if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar20 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar20 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar20 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar20 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar20 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar20 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar20 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (uStack_3a0 >> 7 & 1) == 0) && (uStack_3a0 >> 0xf & 1) == 0) &&
          (uStack_3a0 >> 0x17 & 1) == 0) && (uStack_3a0 >> 0x1f & 1) == 0) &&
        (uStack_3a0 >> 0x27 & 1) == 0) && (uStack_3a0 >> 0x2f & 1) == 0) &&
      (uStack_3a0 >> 0x37 & 1) == 0) && -1 < (long)uStack_3a0) {
    local_1b8 = local_6b8;
    uStack_1b0 = uStack_6b0;
    *in_stack_00000008 = local_6b8;
    in_stack_00000008[1] = uStack_6b0;
    local_1c0 = in_stack_00000008 + 2;
    local_1d8 = local_6b8;
    uStack_1d0 = uStack_6b0;
    *local_1c0 = local_6b8;
    in_stack_00000008[3] = uStack_6b0;
    local_1e0 = in_stack_00000008 + 4;
    local_1f8 = local_6b8;
    uStack_1f0 = uStack_6b0;
    *local_1e0 = local_6b8;
    in_stack_00000008[5] = uStack_6b0;
    local_200 = in_stack_00000008 + 6;
    local_218 = local_6b8;
    uStack_210 = uStack_6b0;
    *local_200 = local_6b8;
    in_stack_00000008[7] = uStack_6b0;
    local_238 = local_6b8;
    uStack_230 = uStack_6b0;
    *in_stack_00000010 = local_6b8;
    in_stack_00000010[1] = uStack_6b0;
    local_240 = in_stack_00000010 + 2;
    local_258 = local_6b8;
    uStack_250 = uStack_6b0;
    *local_240 = local_6b8;
    in_stack_00000010[3] = uStack_6b0;
    local_260 = in_stack_00000010 + 4;
    local_278 = local_6b8;
    uStack_270 = uStack_6b0;
    *local_260 = local_6b8;
    in_stack_00000010[5] = uStack_6b0;
    local_280 = in_stack_00000010 + 6;
    local_298 = local_6b8;
    uStack_290 = uStack_6b0;
    *local_280 = local_6b8;
    in_stack_00000010[7] = uStack_6b0;
    uStack_53c = uStack_6f0._4_4_;
    local_538 = CONCAT44(local_538._4_4_,(undefined4)local_6e8);
    uStack_54c = uStack_6f0._4_4_;
    uStack_544 = (undefined4)((ulong)local_6f8 >> 0x20);
    _local_548 = CONCAT44(uStack_544,(undefined4)local_6e8);
    auVar2._4_8_ = uStack_3c0;
    auVar2._0_4_ = uStack_544;
    auVar46._0_8_ = auVar2._0_8_ << 0x20;
    auVar46._8_4_ = uStack_550;
    auVar46._12_4_ = uStack_6f0._4_4_;
    uStack_6f0 = auVar46._8_8_;
    uStack_55c = uStack_700._4_4_;
    local_558 = local_6f8;
    uStack_56c = uStack_700._4_4_;
    _local_568 = CONCAT44(local_708._4_4_,(undefined4)local_6f8);
    auVar3._4_8_ = uStack_6f0;
    auVar3._0_4_ = local_708._4_4_;
    auVar47._0_8_ = auVar3._0_8_ << 0x20;
    auVar47._8_4_ = uStack_570;
    auVar47._12_4_ = uStack_700._4_4_;
    uStack_700 = auVar47._8_8_;
    uStack_57c = uStack_720._4_4_;
    _local_578 = CONCAT44(local_708._4_4_,(undefined4)local_718);
    uStack_58c = uStack_720._4_4_;
    uStack_584 = (undefined4)((ulong)local_728 >> 0x20);
    _local_588 = CONCAT44(uStack_584,(undefined4)local_718);
    auVar4._4_8_ = uStack_700;
    auVar4._0_4_ = uStack_584;
    auVar48._0_8_ = auVar4._0_8_ << 0x20;
    auVar48._8_4_ = uStack_590;
    auVar48._12_4_ = uStack_720._4_4_;
    uStack_720 = auVar48._8_8_;
    uStack_59c = uStack_710._4_4_;
    _local_598 = CONCAT44(uStack_584,(undefined4)local_708);
    local_5b8 = local_718;
    uStack_5ac = uStack_710._4_4_;
    uStack_5a4 = (undefined4)((ulong)local_718 >> 0x20);
    _local_5a8 = CONCAT44(uStack_5a4,(undefined4)local_708);
    auVar5._4_8_ = uStack_720;
    auVar5._0_4_ = uStack_5a4;
    auVar49._0_8_ = auVar5._0_8_ << 0x20;
    auVar49._8_4_ = uStack_5b0;
    auVar49._12_4_ = uStack_710._4_4_;
    uStack_710 = auVar49._8_8_;
  }
  else {
    auVar6._4_8_ = uStack_3c0;
    auVar6._0_4_ = local_708._4_4_;
    auVar50._0_8_ = auVar6._0_8_ << 0x20;
    auVar50._8_4_ = (undefined4)uStack_700;
    auVar50._12_4_ = uStack_700._4_4_;
    uVar59 = auVar50._8_8_;
    log_scale_00 = (int *)&local_728;
    quant_00[1] = (longlong)palVar35;
    quant_00[0] = (longlong)piVar31;
    round_01[1] = (longlong)&local_690;
    round_01[0] = (longlong)log_scale_00;
    calculate_qcoeff_log_scale((__m128i *)&local_778,round_01,quant_00,palVar36,log_scale_00);
    round_00[1] = (longlong)&local_690;
    round_00[0] = (longlong)log_scale_00;
    uStack_5bc = uStack_6f0._4_4_;
    local_5b8 = CONCAT44(local_5b8._4_4_,(undefined4)local_6e8);
    uStack_5cc = uStack_6f0._4_4_;
    uStack_5c4 = (undefined4)((ulong)local_6f8 >> 0x20);
    _local_5c8 = CONCAT44(uStack_5c4,(undefined4)local_6e8);
    auVar7._4_8_ = uVar59;
    auVar7._0_4_ = uStack_5c4;
    auVar51._0_8_ = auVar7._0_8_ << 0x20;
    auVar51._8_4_ = uStack_5d0;
    auVar51._12_4_ = uStack_6f0._4_4_;
    uStack_6f0 = auVar51._8_8_;
    uStack_5dc = uStack_700._4_4_;
    local_5d8 = local_6f8;
    uStack_5ec = uStack_700._4_4_;
    uStack_5e4 = (undefined4)((ulong)local_708 >> 0x20);
    _local_5e8 = CONCAT44(uStack_5e4,(undefined4)local_6f8);
    auVar8._4_8_ = uStack_6f0;
    auVar8._0_4_ = uStack_5e4;
    auVar52._0_8_ = auVar8._0_8_ << 0x20;
    auVar52._8_4_ = uStack_5f0;
    auVar52._12_4_ = uStack_700._4_4_;
    uStack_700 = auVar52._8_8_;
    uStack_5fc = uStack_720._4_4_;
    _local_5f8 = CONCAT44(uStack_5e4,(undefined4)local_718);
    local_618 = local_728;
    uStack_60c = uStack_720._4_4_;
    uStack_604 = (undefined4)((ulong)local_728 >> 0x20);
    _local_608 = CONCAT44(uStack_604,(undefined4)local_718);
    auVar9._4_8_ = uStack_700;
    auVar9._0_4_ = uStack_604;
    auVar53._0_8_ = auVar9._0_8_ << 0x20;
    auVar53._8_4_ = uStack_610;
    auVar53._12_4_ = uStack_720._4_4_;
    uStack_720 = auVar53._8_8_;
    palVar34 = &local_788;
    quant_01[1] = (longlong)palVar35;
    quant_01[0] = (longlong)piVar31;
    in_stack_fffffffffffff788 = log_scale_00;
    calculate_qcoeff_log_scale(palVar34,round_00,quant_01,palVar36,log_scale_00);
    a_00[1] = (longlong)log_scale_00;
    a_00[0] = (longlong)palVar34;
    sign_01[1] = (longlong)piVar31;
    sign_01[0] = extraout_RDX;
    alVar62 = invert_sign_sse2(a_00,sign_01);
    sign_02[0] = alVar62[1];
    a_01[1] = (longlong)log_scale_00;
    a_01[0] = (longlong)palVar34;
    sign_02[1] = (longlong)piVar31;
    local_778 = extraout_XMM0_Qa_03;
    uStack_770 = extraout_XMM0_Qb_03;
    alVar62 = invert_sign_sse2(a_01,sign_02);
    local_138 = CONCAT26(sStack_792,CONCAT24(sStack_794,CONCAT22(sStack_796,local_798)));
    uStack_130 = CONCAT26(sStack_78a,CONCAT24(sStack_78c,CONCAT22(sStack_78e,sStack_790)));
    local_128 = local_778;
    uStack_120 = uStack_770;
    local_778 = local_778 & local_138;
    uStack_770 = uStack_770 & uStack_130;
    local_158 = CONCAT26(sStack_7a2,CONCAT24(sStack_7a4,CONCAT22(sStack_7a6,local_7a8)));
    uStack_150 = CONCAT26(sStack_79a,CONCAT24(sStack_79c,CONCAT22(sStack_79e,sStack_7a0)));
    auVar22._8_8_ = extraout_XMM0_Qb_04;
    auVar22._0_8_ = extraout_XMM0_Qa_04;
    auVar21._8_8_ = uStack_150;
    auVar21._0_8_ = local_158;
    local_788 = (__m128i)(auVar22 & auVar21);
    coeff_vals[1] = (longlong)log_scale_00;
    coeff_vals[0] = (longlong)in_stack_00000008;
    uVar59 = uStack_150;
    store_coefficients(coeff_vals,alVar62[1]);
    coeff_vals_00[0] = in_stack_00000008 + 4;
    coeff_vals_00[1] = (longlong)log_scale_00;
    store_coefficients(coeff_vals_00,coeff_ptr_00);
    auVar10._4_8_ = uVar59;
    auVar10._0_4_ = local_718._4_4_;
    auVar54._0_8_ = auVar10._0_8_ << 0x20;
    auVar54._8_4_ = (undefined4)uStack_710;
    auVar54._12_4_ = uStack_710._4_4_;
    uVar59 = auVar54._8_8_;
    qcoeff_00[1] = (longlong)qcoeff0_00;
    qcoeff_00[0] = (longlong)qcoeff1_00;
    dequant_00[0]._4_4_ = iVar28;
    dequant_00[0]._0_4_ = iVar27;
    dequant_00[1] = (longlong)threshold_00;
    zero_00[0]._4_4_ = uVar66;
    zero_00[0]._0_4_ = uVar65;
    zero_00[1] = (longlong)in_stack_fffffffffffff818;
    calculate_dqcoeff_and_store_log_scale
              (qcoeff_00,dequant_00,zero_00,
               (tran_low_t *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
               (int *)CONCAT44(uVar64,iVar63));
    uStack_61c = uStack_710._4_4_;
    local_618 = CONCAT44(local_618._4_4_,(undefined4)local_708);
    local_638 = local_718;
    uStack_62c = uStack_710._4_4_;
    uStack_624 = (undefined4)((ulong)local_718 >> 0x20);
    _local_628 = CONCAT44(uStack_624,(undefined4)local_708);
    auVar11._4_8_ = uVar59;
    auVar11._0_4_ = uStack_624;
    auVar55._0_8_ = auVar11._0_8_ << 0x20;
    auVar55._8_4_ = uStack_630;
    auVar55._12_4_ = uStack_710._4_4_;
    uStack_710 = auVar55._8_8_;
    palVar34 = (__m128i *)(in_stack_00000010 + 4);
    cmp_mask1_00 = (__m128i *)&local_690;
    qcoeff_01[1] = (longlong)qcoeff0_00;
    qcoeff_01[0] = (longlong)qcoeff1_00;
    dequant_01[0]._4_4_ = iVar28;
    dequant_01[0]._0_4_ = iVar27;
    dequant_01[1] = (longlong)threshold_00;
    zero_01[0]._4_4_ = uVar66;
    zero_01[0]._0_4_ = uVar65;
    zero_01[1] = (longlong)in_stack_fffffffffffff818;
    calculate_dqcoeff_and_store_log_scale
              (qcoeff_01,dequant_01,zero_01,
               (tran_low_t *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
               (int *)CONCAT44(uVar64,iVar63));
  }
  while (local_690._4_4_ < local_668) {
    load_coefficients(local_660 + local_690._4_4_);
    lVar32 = (long)local_690._4_4_;
    ptVar33 = local_660 + lVar32 + 8;
    local_738 = extraout_XMM0_Qa_05;
    uStack_730 = extraout_XMM0_Qb_05;
    alVar62 = load_coefficients(ptVar33);
    sign_03[0] = alVar62[1];
    local_4c8 = local_738;
    uStack_4c0 = uStack_730;
    local_4cc = 0xf;
    auVar16._8_8_ = uStack_730;
    auVar16._0_8_ = local_738;
    local_758 = psraw(auVar16,ZEXT416(0xf));
    local_4ec = 0xf;
    auVar15._8_8_ = extraout_XMM0_Qb_06;
    auVar15._0_8_ = extraout_XMM0_Qa_06;
    local_768 = psraw(auVar15,ZEXT416(0xf));
    a_02[1] = (longlong)cmp_mask1_00;
    a_02[0] = (longlong)ptVar33;
    sign_03[1] = lVar32;
    alVar62 = invert_sign_sse2(a_02,sign_03);
    sign_04[0] = alVar62[1];
    a_03[1] = (longlong)cmp_mask1_00;
    a_03[0] = (longlong)ptVar33;
    sign_04[1] = lVar32;
    local_778 = extraout_XMM0_Qa_07;
    uStack_770 = extraout_XMM0_Qb_07;
    invert_sign_sse2(a_03,sign_04);
    local_788[1] = extraout_XMM0_Qb_08;
    local_788[0] = extraout_XMM0_Qa_08;
    palVar36 = (__m128i *)&stack0xfffffffffffff838;
    update_mask0(qcoeff0_00,qcoeff1_00,threshold_00,(int16_t *)CONCAT44(iVar28,iVar27),
                 in_stack_fffffffffffff818,(__m128i *)CONCAT44(uVar66,uVar65));
    local_448 = local_778;
    uVar25 = local_448;
    uStack_440 = uStack_770;
    uVar26 = uStack_440;
    local_458 = local_6e8;
    uVar59 = local_458;
    uStack_450 = uStack_6e0;
    uVar12 = uStack_450;
    local_448._0_2_ = (short)local_778;
    local_448._2_2_ = (short)(local_778 >> 0x10);
    local_448._4_2_ = (short)(local_778 >> 0x20);
    local_448._6_2_ = (short)(local_778 >> 0x30);
    uStack_440._0_2_ = (short)uStack_770;
    uStack_440._2_2_ = (short)(uStack_770 >> 0x10);
    uStack_440._4_2_ = (short)(uStack_770 >> 0x20);
    uStack_440._6_2_ = (short)(uStack_770 >> 0x30);
    local_458._0_2_ = (short)local_6e8;
    local_458._2_2_ = (short)((ulong)local_6e8 >> 0x10);
    local_458._4_2_ = (short)((ulong)local_6e8 >> 0x20);
    local_458._6_2_ = (short)((ulong)local_6e8 >> 0x30);
    uStack_450._0_2_ = (short)uStack_6e0;
    uStack_450._2_2_ = (short)((ulong)uStack_6e0 >> 0x10);
    uStack_450._4_2_ = (short)((ulong)uStack_6e0 >> 0x20);
    uStack_450._6_2_ = (short)((ulong)uStack_6e0 >> 0x30);
    local_798 = -(ushort)((short)local_458 < (short)local_448);
    sStack_796 = -(ushort)(local_458._2_2_ < local_448._2_2_);
    sStack_794 = -(ushort)(local_458._4_2_ < local_448._4_2_);
    sStack_792 = -(ushort)(local_458._6_2_ < local_448._6_2_);
    sStack_790 = -(ushort)((short)uStack_450 < (short)uStack_440);
    sStack_78e = -(ushort)(uStack_450._2_2_ < uStack_440._2_2_);
    sStack_78c = -(ushort)(uStack_450._4_2_ < uStack_440._4_2_);
    sStack_78a = -(ushort)(uStack_450._6_2_ < uStack_440._6_2_);
    local_468 = local_788[0];
    lVar23 = local_468;
    uStack_460 = local_788[1];
    lVar24 = uStack_460;
    local_478 = local_6e8;
    uStack_470 = uStack_6e0;
    local_468._0_2_ = (short)local_788[0];
    local_468._2_2_ = local_788[0]._2_2_;
    local_468._4_2_ = local_788[0]._4_2_;
    local_468._6_2_ = local_788[0]._6_2_;
    uStack_460._0_2_ = (short)local_788[1];
    uStack_460._2_2_ = local_788[1]._2_2_;
    uStack_460._4_2_ = local_788[1]._4_2_;
    uStack_460._6_2_ = local_788[1]._6_2_;
    local_7a8 = -(ushort)((short)local_458 < (short)local_468);
    sStack_7a6 = -(ushort)(local_458._2_2_ < local_468._2_2_);
    sStack_7a4 = -(ushort)(local_458._4_2_ < local_468._4_2_);
    sStack_7a2 = -(ushort)(local_458._6_2_ < local_468._6_2_);
    sStack_7a0 = -(ushort)((short)uStack_450 < (short)uStack_460);
    sStack_79e = -(ushort)(uStack_450._2_2_ < uStack_460._2_2_);
    sStack_79c = -(ushort)(uStack_450._4_2_ < uStack_460._4_2_);
    sStack_79a = -(ushort)(uStack_450._6_2_ < uStack_460._6_2_);
    palVar34 = (__m128i *)&local_798;
    cmp_mask1_00 = (__m128i *)&local_7a8;
    piVar31 = &local_6a0;
    palVar35 = (__m128i *)&stack0xfffffffffffff828;
    local_468 = lVar23;
    uStack_460 = lVar24;
    local_458 = uVar59;
    uStack_450 = uVar12;
    local_448 = uVar25;
    uStack_440 = uVar26;
    update_mask1(palVar34,cmp_mask1_00,_qcoeff + local_690._4_4_,piVar31,palVar35);
    local_3e8 = CONCAT26(sStack_792,CONCAT24(sStack_794,CONCAT22(sStack_796,local_798)));
    uStack_3e0 = CONCAT26(sStack_78a,CONCAT24(sStack_78c,CONCAT22(sStack_78e,sStack_790)));
    local_3f8 = CONCAT26(sStack_7a2,CONCAT24(sStack_7a4,CONCAT22(sStack_7a6,local_7a8)));
    uStack_3f0 = CONCAT26(sStack_79a,CONCAT24(sStack_79c,CONCAT22(sStack_79e,sStack_7a0)));
    local_3b8 = local_3e8 | local_3f8;
    uStack_3b0 = uStack_3e0 | uStack_3f0;
    auVar19._8_8_ = uStack_3b0;
    auVar19._0_8_ = local_3b8;
    if ((((((((((((((((auVar19 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar19 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar19 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar19 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar19 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar19 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar19 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar19 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (uStack_3b0 >> 7 & 1) == 0) && (uStack_3b0 >> 0xf & 1) == 0) &&
            (uStack_3b0 >> 0x17 & 1) == 0) && (uStack_3b0 >> 0x1f & 1) == 0) &&
          (uStack_3b0 >> 0x27 & 1) == 0) && (uStack_3b0 >> 0x2f & 1) == 0) &&
        (uStack_3b0 >> 0x37 & 1) == 0) && -1 < (long)uStack_3b0) {
      local_2a0 = (undefined8 *)((long)in_stack_00000008 + (long)local_690._4_4_ * 4);
      local_2b8 = local_6b8;
      uStack_2b0 = uStack_6b0;
      *local_2a0 = local_6b8;
      local_2a0[1] = uStack_6b0;
      local_2c0 = (undefined8 *)((long)in_stack_00000008 + (long)local_690._4_4_ * 4 + 0x10);
      local_2d8 = local_6b8;
      uStack_2d0 = uStack_6b0;
      *local_2c0 = local_6b8;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_690._4_4_ * 4 + 0x18) = uStack_6b0;
      local_2e0 = (undefined8 *)((long)in_stack_00000008 + (long)local_690._4_4_ * 4 + 0x20);
      local_2f8 = local_6b8;
      uStack_2f0 = uStack_6b0;
      *local_2e0 = local_6b8;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_690._4_4_ * 4 + 0x28) = uStack_6b0;
      local_300 = (undefined8 *)((long)in_stack_00000008 + (long)local_690._4_4_ * 4 + 0x30);
      local_318 = local_6b8;
      uStack_310 = uStack_6b0;
      *local_300 = local_6b8;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_690._4_4_ * 4 + 0x38) = uStack_6b0;
      local_320 = (undefined8 *)((long)in_stack_00000010 + (long)local_690._4_4_ * 4);
      local_338 = local_6b8;
      uStack_330 = uStack_6b0;
      *local_320 = local_6b8;
      local_320[1] = uStack_6b0;
      local_340 = (undefined8 *)((long)in_stack_00000010 + (long)local_690._4_4_ * 4 + 0x10);
      local_358 = local_6b8;
      uStack_350 = uStack_6b0;
      *local_340 = local_6b8;
      *(undefined8 *)((long)in_stack_00000010 + (long)local_690._4_4_ * 4 + 0x18) = uStack_6b0;
      local_360 = (undefined8 *)((long)in_stack_00000010 + (long)local_690._4_4_ * 4 + 0x20);
      local_378 = local_6b8;
      uStack_370 = uStack_6b0;
      *local_360 = local_6b8;
      *(undefined8 *)((long)in_stack_00000010 + (long)local_690._4_4_ * 4 + 0x28) = uStack_6b0;
      local_380 = (undefined8 *)((long)in_stack_00000010 + (long)local_690._4_4_ * 4 + 0x30);
      local_398 = local_6b8;
      uStack_390 = uStack_6b0;
      *local_380 = local_6b8;
      *(undefined8 *)((long)in_stack_00000010 + (long)local_690._4_4_ * 4 + 0x38) = uStack_6b0;
      local_690._4_4_ = local_690._4_4_ + 0x10;
    }
    else {
      quant_02[1] = (longlong)palVar35;
      quant_02[0] = (longlong)piVar31;
      round_02[1] = (longlong)&local_690;
      round_02[0] = (longlong)&local_728;
      calculate_qcoeff_log_scale
                ((__m128i *)&local_778,round_02,quant_02,palVar36,in_stack_fffffffffffff788);
      palVar34 = &local_788;
      puVar30 = &local_728;
      quant_03[1] = (longlong)palVar35;
      quant_03[0] = (longlong)piVar31;
      round_03[1] = (longlong)&local_690;
      round_03[0] = (longlong)puVar30;
      calculate_qcoeff_log_scale(palVar34,round_03,quant_03,palVar36,in_stack_fffffffffffff788);
      a_04[1] = (longlong)puVar30;
      a_04[0] = (longlong)palVar34;
      sign_05[1] = (longlong)piVar31;
      sign_05[0] = extraout_RDX_00;
      alVar62 = invert_sign_sse2(a_04,sign_05);
      sign_06[0] = alVar62[1];
      a_05[1] = (longlong)puVar30;
      a_05[0] = (longlong)palVar34;
      sign_06[1] = (longlong)piVar31;
      local_778 = extraout_XMM0_Qa_09;
      uStack_770 = extraout_XMM0_Qb_09;
      alVar62 = invert_sign_sse2(a_05,sign_06);
      local_178 = CONCAT26(sStack_792,CONCAT24(sStack_794,CONCAT22(sStack_796,local_798)));
      uStack_170 = CONCAT26(sStack_78a,CONCAT24(sStack_78c,CONCAT22(sStack_78e,sStack_790)));
      local_168 = local_778;
      uStack_160 = uStack_770;
      local_778 = local_778 & local_178;
      uStack_770 = uStack_770 & uStack_170;
      local_198 = CONCAT26(sStack_7a2,CONCAT24(sStack_7a4,CONCAT22(sStack_7a6,local_7a8)));
      uStack_190 = CONCAT26(sStack_79a,CONCAT24(sStack_79c,CONCAT22(sStack_79e,sStack_7a0)));
      local_788[1] = extraout_XMM0_Qb_10 & uStack_190;
      local_788[0] = extraout_XMM0_Qa_10 & local_198;
      coeff_vals_01[0] = (long)in_stack_00000008 + (long)local_690._4_4_ * 4;
      coeff_vals_01[1] = (longlong)puVar30;
      store_coefficients(coeff_vals_01,alVar62[1]);
      coeff_vals_02[0] = (long)in_stack_00000008 + (long)local_690._4_4_ * 4 + 0x20;
      coeff_vals_02[1] = (longlong)puVar30;
      store_coefficients(coeff_vals_02,coeff_ptr_01);
      qcoeff_02[1] = (longlong)qcoeff0_00;
      qcoeff_02[0] = (longlong)qcoeff1_00;
      dequant_02[0]._4_4_ = iVar28;
      dequant_02[0]._0_4_ = iVar27;
      dequant_02[1] = (longlong)threshold_00;
      zero_02[0]._4_4_ = uVar66;
      zero_02[0]._0_4_ = uVar65;
      zero_02[1] = (longlong)in_stack_fffffffffffff818;
      calculate_dqcoeff_and_store_log_scale
                (qcoeff_02,dequant_02,zero_02,
                 (tran_low_t *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                 (int *)CONCAT44(uVar64,iVar63));
      palVar34 = (__m128i *)((long)in_stack_00000010 + (long)local_690._4_4_ * 4 + 0x20);
      cmp_mask1_00 = (__m128i *)&local_690;
      qcoeff_03[1] = (longlong)qcoeff0_00;
      qcoeff_03[0] = (longlong)qcoeff1_00;
      dequant_03[0]._4_4_ = iVar28;
      dequant_03[0]._0_4_ = iVar27;
      dequant_03[1] = (longlong)threshold_00;
      zero_03[0]._4_4_ = uVar66;
      zero_03[0]._0_4_ = uVar65;
      zero_03[1] = (longlong)in_stack_fffffffffffff818;
      calculate_dqcoeff_and_store_log_scale
                (qcoeff_03,dequant_03,zero_03,
                 (tran_low_t *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                 (int *)CONCAT44(uVar64,iVar63));
      local_690._4_4_ = local_690._4_4_ + 0x10;
    }
  }
  if (local_69c != 0) {
    mask[1] = (longlong)cmp_mask1_00;
    mask[0] = (longlong)palVar34;
    local_694 = calculate_non_zero_count(mask);
  }
  if (local_6a0 != 0) {
    mask_00[1] = (longlong)cmp_mask1_00;
    mask_00[0] = (longlong)palVar34;
    local_698 = calculate_non_zero_count(mask_00);
  }
  while (local_830 = local_698 + -1, local_838 = local_694, local_694 <= local_830) {
    iVar27 = (int)*(short *)(_coeff + (long)local_830 * 2);
    *(undefined4 *)((long)in_stack_00000008 + (long)iVar27 * 4) = 0;
    *(undefined4 *)((long)in_stack_00000010 + (long)iVar27 * 4) = 0;
    local_698 = local_830;
  }
  do {
    local_838 = local_838 + -1;
    if (local_838 < 0) goto LAB_0048b5ef;
  } while (*(int *)((long)in_stack_00000008 +
                   (long)(int)*(short *)(_coeff + (long)local_838 * 2) * 4) == 0);
  local_6a4._0_2_ = (short)local_838;
LAB_0048b5ef:
  *_abs_coeff = (short)local_6a4 + 1;
  local_840 = 0;
  do {
    if (local_694 <= local_840) {
LAB_0048b665:
      if (((-1 < (int)(*_abs_coeff - 1)) && (local_82c == *_abs_coeff - 1)) &&
         ((iVar27 = (int)*(short *)(_coeff + (long)(int)(*_abs_coeff - 1) * 2),
          *(int *)((long)in_stack_00000008 + (long)iVar27 * 4) == 1 ||
          (*(int *)((long)in_stack_00000008 + (long)iVar27 * 4) == -1)))) {
        uVar29 = 0;
        if (local_660[iVar27] << 5 < 0) {
          uVar29 = 0xffffffff;
        }
        if ((int)((local_660[iVar27] << 5 ^ uVar29) - uVar29) <
            *(int *)(&stack0xfffffffffffff820 + (long)(int)(uint)(iVar27 != 0) * 4) * 0x20 +
            (*(short *)((long)_prescan_add_val + (long)(int)(uint)(iVar27 != 0) * 2) * 0x20d + 0x40
            >> 7)) {
          *(undefined4 *)((long)in_stack_00000008 + (long)iVar27 * 4) = 0;
          *(undefined4 *)((long)in_stack_00000010 + (long)iVar27 * 4) = 0;
          *_abs_coeff = 0;
        }
      }
      return;
    }
    if (*(int *)((long)in_stack_00000008 + (long)(int)*(short *)(_coeff + (long)local_840 * 2) * 4)
        != 0) {
      local_82c = local_840;
      goto LAB_0048b665;
    }
    local_840 = local_840 + 1;
  } while( true );
}

Assistant:

void aom_quantize_b_32x32_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  const int log_scale = 1;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i log_scale_vec = _mm_set1_epi16(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, log_scale_vec);
  round = _mm_add_epi16(round, log_scale_vec);
  zbin = _mm_srli_epi16(zbin, log_scale);
  round = _mm_srli_epi16(round, log_scale);
  zbin = _mm_sub_epi16(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  update_mask1(&cmp_mask0, &cmp_mask1, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero, dqcoeff_ptr,
                                          &log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + 8, &log_scale);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index, &is_found0,
                 &mask0);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    update_mask1(&cmp_mask0, &cmp_mask1, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero,
                                          dqcoeff_ptr + index, &log_scale);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + index + 8, &log_scale);
    index += 16;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}